

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildDryRunAllCommandsShown::BuildDryRunAllCommandsShown(BuildDryRunAllCommandsShown *this)

{
  BuildDryRun::BuildDryRun(&this->super_BuildDryRun);
  (this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.super_StateTestWithBuiltinRules.
  super_Test._vptr_Test = (_func_int **)&PTR__BuildWithLogTest_001deb38;
  (this->super_BuildDryRun).super_BuildWithLogTest.super_BuildTest.super_BuildLogUser.
  _vptr_BuildLogUser = (_func_int **)&DAT_001deb78;
  return;
}

Assistant:

TEST_F(BuildDryRun, AllCommandsShown) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule true\n"
"  command = true\n"
"  restat = 1\n"
"rule cc\n"
"  command = cc\n"
"  restat = 1\n"
"build out1: cc in\n"
"build out2: true out1\n"
"build out3: cat out2\n"));

  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Create("out3", "");

  fs_.Tick();

  fs_.Create("in", "");

  // "cc" touches out1, so we should build out2.  But because "true" does not
  // touch out2, we should cancel the build of out3.
  string err;
  EXPECT_TRUE(builder_.AddTarget("out3", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
}